

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O2

vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> * __thiscall
vkt::tessellation::readInterleavedData<tcu::Vector<float,3>>
          (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *__return_storage_ptr__,tessellation *this,int count,void *memory,int offset,int stride)

{
  pointer pVVar1;
  undefined8 *puVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_29;
  
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (__return_storage_ptr__,(long)(int)this,&local_29);
  puVar2 = (undefined8 *)((long)(int)memory + CONCAT44(in_register_00000014,count));
  uVar3 = 0;
  uVar4 = (ulong)this & 0xffffffff;
  if ((int)this < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0xc - uVar3 != 0; uVar3 = uVar3 + 0xc) {
    pVVar1 = (__return_storage_ptr__->
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)pVVar1->m_data + uVar3 + 8) = *(undefined4 *)(puVar2 + 1);
    *(undefined8 *)((long)pVVar1->m_data + uVar3) = *puVar2;
    puVar2 = (undefined8 *)((long)puVar2 + (long)offset);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> readInterleavedData (const int count, const void* memory, const int offset, const int stride)
{
	std::vector<T> results(count);
	const deUint8* pData = static_cast<const deUint8*>(memory) + offset;

	for (int i = 0; i < count; ++i)
	{
		deMemcpy(&results[i], pData, sizeof(T));
		pData += stride;
	}

	return results;
}